

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_application-api.cpp
# Opt level: O0

void __thiscall
AdiakApplicationAPI_C_ZeroCopyTypes_Test::TestBody(AdiakApplicationAPI_C_ZeroCopyTypes_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_cc8;
  Message local_cc0;
  undefined1 local_cb8 [8];
  AssertionResult gtest_ar_79;
  Message local_ca0;
  int local_c94;
  undefined1 local_c90 [8];
  AssertionResult gtest_ar_78;
  Message local_c78;
  adiak_type_t local_c6c;
  undefined1 local_c68 [8];
  AssertionResult gtest_ar_77;
  Message local_c50;
  int local_c48;
  int local_c44;
  undefined1 local_c40 [8];
  AssertionResult gtest_ar_76;
  Message local_c28;
  int local_c20;
  int local_c1c;
  undefined1 local_c18 [8];
  AssertionResult gtest_ar_75;
  Message local_c00;
  int local_bf4;
  undefined1 local_bf0 [8];
  AssertionResult gtest_ar_74;
  Message local_bd8;
  adiak_type_t local_bcc;
  undefined1 local_bc8 [8];
  AssertionResult gtest_ar_73;
  Message local_bb0;
  int local_ba8;
  int local_ba4;
  undefined1 local_ba0 [8];
  AssertionResult gtest_ar_72;
  Message local_b88;
  int local_b80;
  int local_b7c;
  undefined1 local_b78 [8];
  AssertionResult gtest_ar_71;
  Message local_b60;
  int local_b54;
  undefined1 local_b50 [8];
  AssertionResult gtest_ar_70;
  Message local_b38;
  adiak_type_t local_b2c;
  undefined1 local_b28 [8];
  AssertionResult gtest_ar_69;
  Message local_b10;
  int local_b08;
  int local_b04;
  undefined1 local_b00 [8];
  AssertionResult gtest_ar_68;
  Message local_ae8;
  undefined1 local_ae0 [8];
  AssertionResult gtest_ar_67;
  Message local_ac8;
  int local_abc;
  undefined1 local_ab8 [8];
  AssertionResult gtest_ar_66;
  Message local_aa0;
  adiak_type_t local_a94;
  undefined1 local_a90 [8];
  AssertionResult gtest_ar_65;
  Message local_a78;
  int local_a70;
  int local_a6c;
  undefined1 local_a68 [8];
  AssertionResult gtest_ar_64;
  Message local_a50;
  int local_a48;
  int local_a44;
  undefined1 local_a40 [8];
  AssertionResult gtest_ar_63;
  Message local_a28;
  int local_a1c;
  undefined1 local_a18 [8];
  AssertionResult gtest_ar_62;
  Message local_a00;
  adiak_type_t local_9f4;
  undefined1 local_9f0 [8];
  AssertionResult gtest_ar_61;
  Message local_9d8;
  int local_9d0;
  int local_9cc;
  undefined1 local_9c8 [8];
  AssertionResult gtest_ar_60;
  Message local_9b0;
  int local_9a8;
  int local_9a4;
  undefined1 local_9a0 [8];
  AssertionResult gtest_ar_59;
  Message local_988;
  int local_97c;
  undefined1 local_978 [8];
  AssertionResult gtest_ar_58;
  Message local_960;
  adiak_type_t local_954;
  undefined1 local_950 [8];
  AssertionResult gtest_ar_57;
  Message local_938;
  int local_930;
  int local_92c;
  undefined1 local_928 [8];
  AssertionResult gtest_ar_56;
  Message local_910;
  undefined1 local_908 [8];
  AssertionResult gtest_ar_55;
  Message local_8f0;
  int local_8e4;
  undefined1 local_8e0 [8];
  AssertionResult gtest_ar_54;
  Message local_8c8;
  adiak_type_t local_8bc;
  undefined1 local_8b8 [8];
  AssertionResult gtest_ar_53;
  Message local_8a0;
  int local_898;
  int local_894;
  undefined1 local_890 [8];
  AssertionResult gtest_ar_52;
  Message local_878;
  int local_870;
  int local_86c;
  undefined1 local_868 [8];
  AssertionResult gtest_ar_51;
  Message local_850;
  int local_844;
  undefined1 local_840 [8];
  AssertionResult gtest_ar_50;
  Message local_828;
  adiak_type_t local_81c;
  undefined1 local_818 [8];
  AssertionResult gtest_ar_49;
  Message local_800;
  int local_7f8;
  int local_7f4;
  undefined1 local_7f0 [8];
  AssertionResult gtest_ar_48;
  Message local_7d8;
  int local_7d0;
  int local_7cc;
  undefined1 local_7c8 [8];
  AssertionResult gtest_ar_47;
  Message local_7b0;
  undefined1 local_7a8 [8];
  AssertionResult gtest_ar_46;
  Message local_790;
  int local_784;
  undefined1 local_780 [8];
  AssertionResult gtest_ar_45;
  Message local_768;
  adiak_type_t local_75c;
  undefined1 local_758 [8];
  AssertionResult gtest_ar_44;
  Message local_740;
  int local_738;
  int local_734;
  undefined1 local_730 [8];
  AssertionResult gtest_ar_43;
  Message local_718;
  undefined1 local_710 [8];
  AssertionResult gtest_ar_42;
  Message local_6f8;
  int local_6ec;
  undefined1 local_6e8 [8];
  AssertionResult gtest_ar_41;
  Message local_6d0;
  adiak_type_t local_6c4;
  undefined1 local_6c0 [8];
  AssertionResult gtest_ar_40;
  Message local_6a8;
  int local_6a0;
  int local_69c;
  undefined1 local_698 [8];
  AssertionResult gtest_ar_39;
  Message local_680;
  int local_678;
  int local_674;
  undefined1 local_670 [8];
  AssertionResult gtest_ar_38;
  Message local_658;
  int local_64c;
  undefined1 local_648 [8];
  AssertionResult gtest_ar_37;
  Message local_630;
  adiak_type_t local_624;
  undefined1 local_620 [8];
  AssertionResult gtest_ar_36;
  Message local_608;
  int local_600;
  int local_5fc;
  undefined1 local_5f8 [8];
  AssertionResult gtest_ar_35;
  Message local_5e0;
  int local_5d8;
  int local_5d4;
  undefined1 local_5d0 [8];
  AssertionResult gtest_ar_34;
  Message local_5b8;
  int local_5ac;
  undefined1 local_5a8 [8];
  AssertionResult gtest_ar_33;
  Message local_590;
  adiak_type_t local_584;
  undefined1 local_580 [8];
  AssertionResult gtest_ar_32;
  Message local_568;
  int local_560;
  int local_55c;
  undefined1 local_558 [8];
  AssertionResult gtest_ar_31;
  adiak_value_t inner_subval;
  adiak_datatype_t *inner_subtype;
  Message local_530;
  adiak_datatype_t *local_528;
  undefined1 local_520 [8];
  AssertionResult gtest_ar_30;
  Message local_508;
  int local_4fc;
  undefined1 local_4f8 [8];
  AssertionResult gtest_ar_29;
  Message local_4e0;
  adiak_type_t local_4d4;
  undefined1 local_4d0 [8];
  AssertionResult gtest_ar_28;
  Message local_4b8;
  int local_4b0;
  int local_4ac;
  undefined1 local_4a8 [8];
  AssertionResult gtest_ar_27;
  Message local_490;
  int local_488;
  int local_484;
  undefined1 local_480 [8];
  AssertionResult gtest_ar_26;
  Message local_468;
  int local_45c;
  undefined1 local_458 [8];
  AssertionResult gtest_ar_25;
  Message local_440;
  adiak_type_t local_434;
  undefined1 local_430 [8];
  AssertionResult gtest_ar_24;
  Message local_418;
  int local_410;
  int local_40c;
  undefined1 local_408 [8];
  AssertionResult gtest_ar_23;
  Message local_3f0;
  adiak_value_t local_3e8;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar_22;
  Message local_3c8;
  undefined1 local_3c0 [8];
  AssertionResult gtest_ar_21;
  Message local_3a8;
  int local_39c;
  undefined1 local_398 [8];
  AssertionResult gtest_ar_20;
  Message local_380;
  adiak_type_t local_374;
  undefined1 local_370 [8];
  AssertionResult gtest_ar_19;
  Message local_358;
  int local_350;
  int local_34c;
  undefined1 local_348 [8];
  AssertionResult gtest_ar_18;
  Message local_330;
  int local_324;
  undefined1 local_320 [8];
  AssertionResult gtest_ar_17;
  Message local_308;
  adiak_type_t local_2fc;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar_16;
  Message local_2e0;
  int local_2d8;
  int local_2d4;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar_15;
  Message local_2b8;
  int local_2ac;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_14;
  Message local_290;
  adiak_type_t local_284;
  undefined1 local_280 [8];
  AssertionResult gtest_ar_13;
  Message local_268;
  int local_260;
  int local_25c;
  undefined1 local_258 [8];
  AssertionResult gtest_ar_12;
  Message local_240;
  int local_238;
  int local_234;
  undefined1 local_230 [8];
  AssertionResult gtest_ar_11;
  Message local_218;
  int local_20c;
  undefined1 local_208 [8];
  AssertionResult gtest_ar_10;
  Message local_1f0;
  int local_1e4;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_9;
  Message local_1c8;
  adiak_type_t local_1bc;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_8;
  Message local_1a0;
  int local_198;
  int local_194;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_7;
  adiak_datatype_t *subtype;
  adiak_value_t subval;
  char *subcat;
  adiak_value_t *paStack_160;
  int cat;
  adiak_value_t *val;
  adiak_datatype_t *dtype;
  Message local_148;
  int local_140;
  int local_13c;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_6;
  Message local_120;
  int local_118;
  int local_114;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_5;
  Message local_f8;
  int local_f0;
  int local_ec;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_4;
  Message local_d0;
  int local_c8;
  int local_c4;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_3;
  Message local_a8;
  int local_a0;
  int local_9c;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_2;
  char *strings [2];
  AssertHelper local_70;
  Message local_68;
  int local_60;
  int local_5c;
  undefined1 local_58 [8];
  AssertionResult gtest_ar_1;
  Message local_40 [3];
  int local_28;
  int local_24;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  AdiakApplicationAPI_C_ZeroCopyTypes_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  local_24 = adiak_namevalue("cz:ref:vec:int",2,(char *)0x0,"&{%d}",s_array,9);
  local_28 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_20,
             "adiak_namevalue(\"cz:ref:vec:int\", 2, __null, \"&{%d}\", s_array, 9)","0",&local_24,
             &local_28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_40);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x116,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_5c = adiak_namevalue("cz:ref:string",2,(char *)0x0,"&%s",s_string_a);
  local_60 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_58,
             "adiak_namevalue(\"cz:ref:string\", 2, __null, \"&%s\", s_string_a)","0",&local_5c,
             &local_60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(&local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x118,pcVar2);
    testing::internal::AssertHelper::operator=(&local_70,&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::Message::~Message(&local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  gtest_ar_2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )s_string_a;
  local_9c = adiak_namevalue("cz:vec:ref:string",2,(char *)0x0,"[&%s]",&gtest_ar_2.message_);
  local_a0 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_98,
             "adiak_namevalue(\"cz:vec:ref:string\", 2, __null, \"[&%s]\", strings, 2)","0",
             &local_9c,&local_a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x11b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  local_c4 = adiak_namevalue("cz:vec:tpl",2,(char *)0x0,"{(%lld,%s)}",s_hello_data,3,2);
  local_c8 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_c0,
             "adiak_namevalue(\"cz:vec:tpl\", 2, __null, \"{(%lld,%s)}\", s_hello_data, 3, 2)","0",
             &local_c4,&local_c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x11d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  local_ec = adiak_namevalue("cz:ref:vec:tpl",2,(char *)0x0,"&{(%lld,%s)}",s_hello_data,3,2);
  local_f0 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_e8,
             "adiak_namevalue(\"cz:ref:vec:tpl\", 2, __null, \"&{(%lld,%s)}\", s_hello_data, 3, 2)",
             "0",&local_ec,&local_f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x11f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  local_114 = adiak_namevalue("cz:vec:ref:tpl",2,(char *)0x0,"{&(%lld,%s)}",s_hello_data,3,2);
  local_118 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_110,
             "adiak_namevalue(\"cz:vec:ref:tpl\", 2, __null, \"{&(%lld,%s)}\", s_hello_data, 3, 2)",
             "0",&local_114,&local_118);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x123,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  local_13c = adiak_namevalue("cz:vec:tpl:ref",2,(char *)0x0,"{(%lld,&%s)}",s_hello_data,3,2);
  local_140 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_138,
             "adiak_namevalue(\"cz:vec:tpl:ref\", 2, __null, \"{(%lld,&%s)}\", s_hello_data, 3, 2)",
             "0",&local_13c,&local_140);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_148);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&dtype,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x125,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&dtype,&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&dtype);
    testing::Message::~Message(&local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  val = (adiak_value_t *)0x0;
  paStack_160 = (adiak_value_t *)0x0;
  subcat._4_4_ = 0;
  subval.v_long = 0;
  gtest_ar_7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  local_194 = adiak_get_nameval("cz:ref:vec:int",(adiak_datatype_t **)&val,&stack0xfffffffffffffea0,
                                (int *)((long)&subcat + 4),(char **)&subval.v_ptr);
  local_198 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_190,
             "adiak_get_nameval(\"cz:ref:vec:int\", &dtype, &val, &cat, &subcat)","0",&local_194,
             &local_198);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x12e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  local_1bc = adiak_list;
  testing::internal::EqHelper::Compare<adiak_type_t,_adiak_type_t,_nullptr>
            ((EqHelper *)local_1b8,"dtype->dtype","adiak_type_t::adiak_list",
             (adiak_type_t *)&val->v_int,&local_1bc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar1) {
    testing::Message::Message(&local_1c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x12f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  local_1e4 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1e0,"dtype->is_reference","1",&val[3].v_int,&local_1e4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(&local_1f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x130,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  local_20c = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_208,"cat","2",(int *)((long)&subcat + 4),&local_20c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
  if (!bVar1) {
    testing::Message::Message(&local_218);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_208);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x131,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_218);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
  local_234 = adiak_num_subvals((adiak_datatype_t *)val);
  local_238 = 9;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_230,"adiak_num_subvals(dtype)","9",&local_234,&local_238);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar1) {
    testing::Message::Message(&local_240);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_230);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x132,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_240);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_240);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  local_25c = adiak_get_subval((adiak_datatype_t *)val,paStack_160,0,
                               (adiak_datatype_t **)&gtest_ar_7.message_,(adiak_value_t *)&subtype);
  local_260 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_258,"adiak_get_subval(dtype, val, 0, &subtype, &subval)","0",
             &local_25c,&local_260);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
  if (!bVar1) {
    testing::Message::Message(&local_268);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_258);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x133,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_268);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  local_284 = adiak_int;
  testing::internal::EqHelper::Compare<adiak_type_t,_adiak_type_t,_nullptr>
            ((EqHelper *)local_280,"subtype->dtype","adiak_type_t::adiak_int",
             (adiak_type_t *)
             gtest_ar_7.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,&local_284);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
  if (!bVar1) {
    testing::Message::Message(&local_290);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_280);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x134,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_290);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
  local_2ac = -1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_2a8,"subval.v_int","-1",(int *)&subtype,&local_2ac);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
  if (!bVar1) {
    testing::Message::Message(&local_2b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x135,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
  local_2d4 = adiak_get_subval((adiak_datatype_t *)val,paStack_160,2,
                               (adiak_datatype_t **)&gtest_ar_7.message_,(adiak_value_t *)&subtype);
  local_2d8 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_2d0,"adiak_get_subval(dtype, val, 2, &subtype, &subval)","0",
             &local_2d4,&local_2d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar1) {
    testing::Message::Message(&local_2e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x136,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_2e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_2e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  local_2fc = adiak_int;
  testing::internal::EqHelper::Compare<adiak_type_t,_adiak_type_t,_nullptr>
            ((EqHelper *)local_2f8,"subtype->dtype","adiak_type_t::adiak_int",
             (adiak_type_t *)
             gtest_ar_7.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,&local_2fc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
  if (!bVar1) {
    testing::Message::Message(&local_308);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x137,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_308);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_308);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
  local_324 = -3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_320,"subval.v_int","-3",(int *)&subtype,&local_324);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
  if (!bVar1) {
    testing::Message::Message(&local_330);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_320);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x138,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_330);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_330);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
  local_34c = adiak_get_nameval("cz:ref:string",(adiak_datatype_t **)&val,&stack0xfffffffffffffea0,
                                (int *)0x0,(char **)0x0);
  local_350 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_348,
             "adiak_get_nameval(\"cz:ref:string\", &dtype, &val, nullptr, nullptr)","0",&local_34c,
             &local_350);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_348);
  if (!bVar1) {
    testing::Message::Message(&local_358);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_348);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x13a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_358);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
  local_374 = adiak_string;
  testing::internal::EqHelper::Compare<adiak_type_t,_adiak_type_t,_nullptr>
            ((EqHelper *)local_370,"dtype->dtype","adiak_type_t::adiak_string",
             (adiak_type_t *)&val->v_int,&local_374);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
  if (!bVar1) {
    testing::Message::Message(&local_380);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x13b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_380);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_380);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
  local_39c = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_398,"dtype->is_reference","1",&val[3].v_int,&local_39c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_398);
  if (!bVar1) {
    testing::Message::Message(&local_3a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_398);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x13c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_3a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_3a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_398);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_3c0,"static_cast<char*>(val->v_ptr)","\"Static string A\"",
             (char *)paStack_160->v_ptr,"Static string A");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c0);
  if (!bVar1) {
    testing::Message::Message(&local_3c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x13d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(&local_3c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c0);
  local_3e8 = *paStack_160;
  testing::internal::EqHelper::Compare<const_char_*,_const_char_*,_nullptr>
            ((EqHelper *)local_3e0,"static_cast<const char*>(val->v_ptr)","s_string_a",
             (char **)&local_3e8.v_ptr,&s_string_a);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e0);
  if (!bVar1) {
    testing::Message::Message(&local_3f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x13e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_3f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(&local_3f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
  local_40c = adiak_get_nameval("cz:vec:ref:string",(adiak_datatype_t **)&val,
                                &stack0xfffffffffffffea0,(int *)((long)&subcat + 4),
                                (char **)&subval.v_ptr);
  local_410 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_408,
             "adiak_get_nameval(\"cz:vec:ref:string\", &dtype, &val, &cat, &subcat)","0",&local_40c,
             &local_410);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_408);
  if (!bVar1) {
    testing::Message::Message(&local_418);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_408);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x140,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_24.message_,&local_418);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_24.message_);
    testing::Message::~Message(&local_418);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_408);
  local_434 = adiak_set;
  testing::internal::EqHelper::Compare<adiak_type_t,_adiak_type_t,_nullptr>
            ((EqHelper *)local_430,"dtype->dtype","adiak_type_t::adiak_set",
             (adiak_type_t *)&val->v_int,&local_434);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_430);
  if (!bVar1) {
    testing::Message::Message(&local_440);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_430);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x141,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,&local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(&local_440);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_430);
  local_45c = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_458,"dtype->is_reference","0",&val[3].v_int,&local_45c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_458);
  if (!bVar1) {
    testing::Message::Message(&local_468);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_458);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_26.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x142,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_26.message_,&local_468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26.message_);
    testing::Message::~Message(&local_468);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_458);
  local_484 = adiak_num_subvals((adiak_datatype_t *)val);
  local_488 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_480,"adiak_num_subvals(dtype)","2",&local_484,&local_488);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_480);
  if (!bVar1) {
    testing::Message::Message(&local_490);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_480);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_27.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x143,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_27.message_,&local_490);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_27.message_);
    testing::Message::~Message(&local_490);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_480);
  local_4ac = adiak_get_subval((adiak_datatype_t *)val,paStack_160,1,
                               (adiak_datatype_t **)&gtest_ar_7.message_,(adiak_value_t *)&subtype);
  local_4b0 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_4a8,"adiak_get_subval(dtype, val, 1, &subtype, &subval)","0",
             &local_4ac,&local_4b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a8);
  if (!bVar1) {
    testing::Message::Message(&local_4b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_28.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x144,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_28.message_,&local_4b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_28.message_);
    testing::Message::~Message(&local_4b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a8);
  local_4d4 = adiak_string;
  testing::internal::EqHelper::Compare<adiak_type_t,_adiak_type_t,_nullptr>
            ((EqHelper *)local_4d0,"subtype->dtype","adiak_type_t::adiak_string",
             (adiak_type_t *)
             gtest_ar_7.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,&local_4d4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d0);
  if (!bVar1) {
    testing::Message::Message(&local_4e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x145,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29.message_,&local_4e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29.message_);
    testing::Message::~Message(&local_4e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d0);
  local_4fc = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_4f8,"subtype->is_reference","1",
             (int *)((long)gtest_ar_7.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl + 0x18),&local_4fc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f8);
  if (!bVar1) {
    testing::Message::Message(&local_508);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_30.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x146,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_30.message_,&local_508);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_30.message_);
    testing::Message::~Message(&local_508);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f8);
  local_528 = subtype;
  testing::internal::EqHelper::Compare<const_char_*,_const_char_*,_nullptr>
            ((EqHelper *)local_520,"static_cast<const char*>(subval.v_ptr)","s_string_b",
             (char **)&local_528,&s_string_b);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_520);
  if (!bVar1) {
    testing::Message::Message(&local_530);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_520);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&inner_subtype,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x147,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&inner_subtype,&local_530);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&inner_subtype);
    testing::Message::~Message(&local_530);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_520);
  local_55c = adiak_get_nameval("cz:vec:tpl",(adiak_datatype_t **)&val,&stack0xfffffffffffffea0,
                                (int *)((long)&subcat + 4),(char **)&subval.v_ptr);
  local_560 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_558,"adiak_get_nameval(\"cz:vec:tpl\", &dtype, &val, &cat, &subcat)",
             "0",&local_55c,&local_560);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_558);
  if (!bVar1) {
    testing::Message::Message(&local_568);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_558);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_32.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x14c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_32.message_,&local_568);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_32.message_);
    testing::Message::~Message(&local_568);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_558);
  local_584 = adiak_list;
  testing::internal::EqHelper::Compare<adiak_type_t,_adiak_type_t,_nullptr>
            ((EqHelper *)local_580,"dtype->dtype","adiak_type_t::adiak_list",
             (adiak_type_t *)&val->v_int,&local_584);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_580);
  if (!bVar1) {
    testing::Message::Message(&local_590);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_580);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_33.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x14d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_33.message_,&local_590);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_33.message_);
    testing::Message::~Message(&local_590);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_580);
  local_5ac = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_5a8,"dtype->is_reference","0",&val[3].v_int,&local_5ac);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5a8);
  if (!bVar1) {
    testing::Message::Message(&local_5b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x14e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34.message_,&local_5b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34.message_);
    testing::Message::~Message(&local_5b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a8);
  local_5d4 = adiak_num_subvals((adiak_datatype_t *)val);
  local_5d8 = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_5d0,"adiak_num_subvals(dtype)","3",&local_5d4,&local_5d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d0);
  if (!bVar1) {
    testing::Message::Message(&local_5e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_35.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x14f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_35.message_,&local_5e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_35.message_);
    testing::Message::~Message(&local_5e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d0);
  local_5fc = adiak_get_subval((adiak_datatype_t *)val,paStack_160,1,
                               (adiak_datatype_t **)&gtest_ar_7.message_,(adiak_value_t *)&subtype);
  local_600 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_5f8,"adiak_get_subval(dtype, val, 1, &subtype, &subval)","0",
             &local_5fc,&local_600);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f8);
  if (!bVar1) {
    testing::Message::Message(&local_608);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_36.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x150,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_36.message_,&local_608);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_36.message_);
    testing::Message::~Message(&local_608);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f8);
  local_624 = adiak_tuple;
  testing::internal::EqHelper::Compare<adiak_type_t,_adiak_type_t,_nullptr>
            ((EqHelper *)local_620,"subtype->dtype","adiak_type_t::adiak_tuple",
             (adiak_type_t *)
             gtest_ar_7.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,&local_624);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_620);
  if (!bVar1) {
    testing::Message::Message(&local_630);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_620);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_37.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x151,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_37.message_,&local_630);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_37.message_);
    testing::Message::~Message(&local_630);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_620);
  local_64c = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_648,"subtype->is_reference","0",
             (int *)((long)gtest_ar_7.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl + 0x18),&local_64c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_648);
  if (!bVar1) {
    testing::Message::Message(&local_658);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_648);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_38.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x152,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_38.message_,&local_658);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_38.message_);
    testing::Message::~Message(&local_658);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_648);
  local_674 = adiak_num_subvals((adiak_datatype_t *)
                                gtest_ar_7.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl);
  local_678 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_670,"adiak_num_subvals(subtype)","2",&local_674,&local_678);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_670);
  if (!bVar1) {
    testing::Message::Message(&local_680);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_670);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_39.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x153,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_39.message_,&local_680);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_39.message_);
    testing::Message::~Message(&local_680);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_670);
  local_69c = adiak_get_subval((adiak_datatype_t *)
                               gtest_ar_7.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl,(adiak_value_t *)&subtype,1,
                               (adiak_datatype_t **)&inner_subval.v_ptr,
                               (adiak_value_t *)&gtest_ar_31.message_);
  local_6a0 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_698,
             "adiak_get_subval(subtype, &subval, 1, &inner_subtype, &inner_subval)","0",&local_69c,
             &local_6a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_698);
  if (!bVar1) {
    testing::Message::Message(&local_6a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_698);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_40.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x154,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_40.message_,&local_6a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_40.message_);
    testing::Message::~Message(&local_6a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_698);
  local_6c4 = adiak_string;
  testing::internal::EqHelper::Compare<adiak_type_t,_adiak_type_t,_nullptr>
            ((EqHelper *)local_6c0,"inner_subtype->dtype","adiak_type_t::adiak_string",
             (adiak_type_t *)inner_subval.v_ptr,&local_6c4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6c0);
  if (!bVar1) {
    testing::Message::Message(&local_6d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_41.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x155,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_41.message_,&local_6d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_41.message_);
    testing::Message::~Message(&local_6d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6c0);
  local_6ec = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_6e8,"inner_subtype->is_reference","0",
             (int *)(inner_subval.v_long + 0x18),&local_6ec);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6e8);
  if (!bVar1) {
    testing::Message::Message(&local_6f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_42.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x156,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_42.message_,&local_6f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_42.message_);
    testing::Message::~Message(&local_6f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6e8);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_710,"static_cast<const char*>(inner_subval.v_ptr)","\"Adiak\"",
             (char *)gtest_ar_31.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,"Adiak");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_710);
  if (!bVar1) {
    testing::Message::Message(&local_718);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_710);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_43.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x157,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_43.message_,&local_718);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_43.message_);
    testing::Message::~Message(&local_718);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_710);
  local_734 = adiak_get_nameval("cz:ref:vec:tpl",(adiak_datatype_t **)&val,&stack0xfffffffffffffea0,
                                (int *)((long)&subcat + 4),(char **)&subval.v_ptr);
  local_738 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_730,
             "adiak_get_nameval(\"cz:ref:vec:tpl\", &dtype, &val, &cat, &subcat)","0",&local_734,
             &local_738);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_730);
  if (!bVar1) {
    testing::Message::Message(&local_740);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_730);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_44.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x159,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_44.message_,&local_740);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_44.message_);
    testing::Message::~Message(&local_740);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_730);
  local_75c = adiak_list;
  testing::internal::EqHelper::Compare<adiak_type_t,_adiak_type_t,_nullptr>
            ((EqHelper *)local_758,"dtype->dtype","adiak_type_t::adiak_list",
             (adiak_type_t *)&val->v_int,&local_75c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_758);
  if (!bVar1) {
    testing::Message::Message(&local_768);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_758);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_45.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x15a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_45.message_,&local_768);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_45.message_);
    testing::Message::~Message(&local_768);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_758);
  local_784 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_780,"dtype->is_reference","1",&val[3].v_int,&local_784);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_780);
  if (!bVar1) {
    testing::Message::Message(&local_790);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_780);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_46.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x15b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_46.message_,&local_790);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_46.message_);
    testing::Message::~Message(&local_790);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_780);
  testing::internal::EqHelper::Compare<void_*,_int_string_tuple[3],_nullptr>
            ((EqHelper *)local_7a8,"val->v_ptr","s_hello_data",&paStack_160->v_ptr,&s_hello_data);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7a8);
  if (!bVar1) {
    testing::Message::Message(&local_7b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_47.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x15c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_47.message_,&local_7b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_47.message_);
    testing::Message::~Message(&local_7b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7a8);
  local_7cc = adiak_num_subvals((adiak_datatype_t *)val);
  local_7d0 = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_7c8,"adiak_num_subvals(dtype)","3",&local_7cc,&local_7d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7c8);
  if (!bVar1) {
    testing::Message::Message(&local_7d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_48.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x15d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_48.message_,&local_7d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_48.message_);
    testing::Message::~Message(&local_7d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7c8);
  local_7f4 = adiak_get_subval((adiak_datatype_t *)val,paStack_160,1,
                               (adiak_datatype_t **)&gtest_ar_7.message_,(adiak_value_t *)&subtype);
  local_7f8 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_7f0,"adiak_get_subval(dtype, val, 1, &subtype, &subval)","0",
             &local_7f4,&local_7f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7f0);
  if (!bVar1) {
    testing::Message::Message(&local_800);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_49.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x15e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_49.message_,&local_800);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_49.message_);
    testing::Message::~Message(&local_800);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7f0);
  local_81c = adiak_tuple;
  testing::internal::EqHelper::Compare<adiak_type_t,_adiak_type_t,_nullptr>
            ((EqHelper *)local_818,"subtype->dtype","adiak_type_t::adiak_tuple",
             (adiak_type_t *)
             gtest_ar_7.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,&local_81c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_818);
  if (!bVar1) {
    testing::Message::Message(&local_828);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_818);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_50.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x15f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_50.message_,&local_828);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_50.message_);
    testing::Message::~Message(&local_828);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_818);
  local_844 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_840,"subtype->is_reference","1",
             (int *)((long)gtest_ar_7.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl + 0x18),&local_844);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_840);
  if (!bVar1) {
    testing::Message::Message(&local_850);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_840);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_51.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x160,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_51.message_,&local_850);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_51.message_);
    testing::Message::~Message(&local_850);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_840);
  local_86c = adiak_num_subvals((adiak_datatype_t *)
                                gtest_ar_7.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl);
  local_870 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_868,"adiak_num_subvals(subtype)","2",&local_86c,&local_870);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_868);
  if (!bVar1) {
    testing::Message::Message(&local_878);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_868);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_52.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x161,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_52.message_,&local_878);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_52.message_);
    testing::Message::~Message(&local_878);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_868);
  local_894 = adiak_get_subval((adiak_datatype_t *)
                               gtest_ar_7.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl,(adiak_value_t *)&subtype,1,
                               (adiak_datatype_t **)&inner_subval.v_ptr,
                               (adiak_value_t *)&gtest_ar_31.message_);
  local_898 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_890,
             "adiak_get_subval(subtype, &subval, 1, &inner_subtype, &inner_subval)","0",&local_894,
             &local_898);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_890);
  if (!bVar1) {
    testing::Message::Message(&local_8a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_890);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_53.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x162,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_53.message_,&local_8a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_53.message_);
    testing::Message::~Message(&local_8a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_890);
  local_8bc = adiak_string;
  testing::internal::EqHelper::Compare<adiak_type_t,_adiak_type_t,_nullptr>
            ((EqHelper *)local_8b8,"inner_subtype->dtype","adiak_type_t::adiak_string",
             (adiak_type_t *)inner_subval.v_ptr,&local_8bc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8b8);
  if (!bVar1) {
    testing::Message::Message(&local_8c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_54.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x163,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_54.message_,&local_8c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_54.message_);
    testing::Message::~Message(&local_8c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8b8);
  local_8e4 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_8e0,"inner_subtype->is_reference","1",
             (int *)(inner_subval.v_long + 0x18),&local_8e4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8e0);
  if (!bVar1) {
    testing::Message::Message(&local_8f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_55.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x164,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_55.message_,&local_8f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_55.message_);
    testing::Message::~Message(&local_8f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8e0);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_908,"static_cast<const char*>(inner_subval.v_ptr)","\"Adiak\"",
             (char *)gtest_ar_31.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,"Adiak");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_908);
  if (!bVar1) {
    testing::Message::Message(&local_910);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_908);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_56.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x165,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_56.message_,&local_910);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_56.message_);
    testing::Message::~Message(&local_910);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_908);
  local_92c = adiak_get_nameval("cz:vec:ref:tpl",(adiak_datatype_t **)&val,&stack0xfffffffffffffea0,
                                (int *)((long)&subcat + 4),(char **)&subval.v_ptr);
  local_930 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_928,
             "adiak_get_nameval(\"cz:vec:ref:tpl\", &dtype, &val, &cat, &subcat)","0",&local_92c,
             &local_930);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_928);
  if (!bVar1) {
    testing::Message::Message(&local_938);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_928);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_57.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x167,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_57.message_,&local_938);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_57.message_);
    testing::Message::~Message(&local_938);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_928);
  local_954 = adiak_list;
  testing::internal::EqHelper::Compare<adiak_type_t,_adiak_type_t,_nullptr>
            ((EqHelper *)local_950,"dtype->dtype","adiak_type_t::adiak_list",
             (adiak_type_t *)&val->v_int,&local_954);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_950);
  if (!bVar1) {
    testing::Message::Message(&local_960);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_950);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_58.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x168,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_58.message_,&local_960);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_58.message_);
    testing::Message::~Message(&local_960);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_950);
  local_97c = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_978,"dtype->is_reference","0",&val[3].v_int,&local_97c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_978);
  if (!bVar1) {
    testing::Message::Message(&local_988);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_978);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_59.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x169,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_59.message_,&local_988);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_59.message_);
    testing::Message::~Message(&local_988);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_978);
  local_9a4 = adiak_num_subvals((adiak_datatype_t *)val);
  local_9a8 = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_9a0,"adiak_num_subvals(dtype)","3",&local_9a4,&local_9a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9a0);
  if (!bVar1) {
    testing::Message::Message(&local_9b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_9a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_60.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x16a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_60.message_,&local_9b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_60.message_);
    testing::Message::~Message(&local_9b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9a0);
  local_9cc = adiak_get_subval((adiak_datatype_t *)val,paStack_160,1,
                               (adiak_datatype_t **)&gtest_ar_7.message_,(adiak_value_t *)&subtype);
  local_9d0 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_9c8,"adiak_get_subval(dtype, val, 1, &subtype, &subval)","0",
             &local_9cc,&local_9d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9c8);
  if (!bVar1) {
    testing::Message::Message(&local_9d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_9c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_61.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x16b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_61.message_,&local_9d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_61.message_);
    testing::Message::~Message(&local_9d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9c8);
  local_9f4 = adiak_tuple;
  testing::internal::EqHelper::Compare<adiak_type_t,_adiak_type_t,_nullptr>
            ((EqHelper *)local_9f0,"subtype->dtype","adiak_type_t::adiak_tuple",
             (adiak_type_t *)
             gtest_ar_7.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,&local_9f4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9f0);
  if (!bVar1) {
    testing::Message::Message(&local_a00);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_9f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_62.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x16c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_62.message_,&local_a00);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_62.message_);
    testing::Message::~Message(&local_a00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9f0);
  local_a1c = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_a18,"subtype->is_reference","1",
             (int *)((long)gtest_ar_7.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl + 0x18),&local_a1c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a18);
  if (!bVar1) {
    testing::Message::Message(&local_a28);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a18);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_63.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x16d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_63.message_,&local_a28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_63.message_);
    testing::Message::~Message(&local_a28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a18);
  local_a44 = adiak_num_subvals((adiak_datatype_t *)
                                gtest_ar_7.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl);
  local_a48 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_a40,"adiak_num_subvals(subtype)","2",&local_a44,&local_a48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a40);
  if (!bVar1) {
    testing::Message::Message(&local_a50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_64.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x16e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_64.message_,&local_a50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_64.message_);
    testing::Message::~Message(&local_a50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a40);
  local_a6c = adiak_get_subval((adiak_datatype_t *)
                               gtest_ar_7.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl,(adiak_value_t *)&subtype,0,
                               (adiak_datatype_t **)&inner_subval.v_ptr,
                               (adiak_value_t *)&gtest_ar_31.message_);
  local_a70 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_a68,
             "adiak_get_subval(subtype, &subval, 0, &inner_subtype, &inner_subval)","0",&local_a6c,
             &local_a70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a68);
  if (!bVar1) {
    testing::Message::Message(&local_a78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_65.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x16f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_65.message_,&local_a78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_65.message_);
    testing::Message::~Message(&local_a78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a68);
  local_a94 = adiak_longlong;
  testing::internal::EqHelper::Compare<adiak_type_t,_adiak_type_t,_nullptr>
            ((EqHelper *)local_a90,"inner_subtype->dtype","adiak_type_t::adiak_longlong",
             (adiak_type_t *)inner_subval.v_ptr,&local_a94);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a90);
  if (!bVar1) {
    testing::Message::Message(&local_aa0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_66.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x170,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_66.message_,&local_aa0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_66.message_);
    testing::Message::~Message(&local_aa0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a90);
  local_abc = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_ab8,"inner_subtype->is_reference","0",
             (int *)(inner_subval.v_long + 0x18),&local_abc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ab8);
  if (!bVar1) {
    testing::Message::Message(&local_ac8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ab8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_67.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x171,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_67.message_,&local_ac8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_67.message_);
    testing::Message::~Message(&local_ac8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ab8);
  testing::internal::EqHelper::Compare
            ((EqHelper *)local_ae0,"inner_subval.v_longlong","2ll",
             (BiggestInt)
             gtest_ar_31.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ae0);
  if (!bVar1) {
    testing::Message::Message(&local_ae8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ae0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_68.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x172,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_68.message_,&local_ae8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_68.message_);
    testing::Message::~Message(&local_ae8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ae0);
  local_b04 = adiak_get_nameval("cz:vec:tpl:ref",(adiak_datatype_t **)&val,&stack0xfffffffffffffea0,
                                (int *)((long)&subcat + 4),(char **)&subval.v_ptr);
  local_b08 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_b00,
             "adiak_get_nameval(\"cz:vec:tpl:ref\", &dtype, &val, &cat, &subcat)","0",&local_b04,
             &local_b08);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b00);
  if (!bVar1) {
    testing::Message::Message(&local_b10);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b00);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_69.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x174,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_69.message_,&local_b10);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_69.message_);
    testing::Message::~Message(&local_b10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b00);
  local_b2c = adiak_list;
  testing::internal::EqHelper::Compare<adiak_type_t,_adiak_type_t,_nullptr>
            ((EqHelper *)local_b28,"dtype->dtype","adiak_type_t::adiak_list",
             (adiak_type_t *)&val->v_int,&local_b2c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b28);
  if (!bVar1) {
    testing::Message::Message(&local_b38);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_70.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x175,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_70.message_,&local_b38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_70.message_);
    testing::Message::~Message(&local_b38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b28);
  local_b54 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_b50,"dtype->is_reference","0",&val[3].v_int,&local_b54);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b50);
  if (!bVar1) {
    testing::Message::Message(&local_b60);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_71.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x176,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_71.message_,&local_b60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_71.message_);
    testing::Message::~Message(&local_b60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b50);
  local_b7c = adiak_num_subvals((adiak_datatype_t *)val);
  local_b80 = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_b78,"adiak_num_subvals(dtype)","3",&local_b7c,&local_b80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b78);
  if (!bVar1) {
    testing::Message::Message(&local_b88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_72.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x177,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_72.message_,&local_b88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_72.message_);
    testing::Message::~Message(&local_b88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b78);
  local_ba4 = adiak_get_subval((adiak_datatype_t *)val,paStack_160,1,
                               (adiak_datatype_t **)&gtest_ar_7.message_,(adiak_value_t *)&subtype);
  local_ba8 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_ba0,"adiak_get_subval(dtype, val, 1, &subtype, &subval)","0",
             &local_ba4,&local_ba8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ba0);
  if (!bVar1) {
    testing::Message::Message(&local_bb0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ba0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_73.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x178,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_73.message_,&local_bb0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_73.message_);
    testing::Message::~Message(&local_bb0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ba0);
  local_bcc = adiak_tuple;
  testing::internal::EqHelper::Compare<adiak_type_t,_adiak_type_t,_nullptr>
            ((EqHelper *)local_bc8,"subtype->dtype","adiak_type_t::adiak_tuple",
             (adiak_type_t *)
             gtest_ar_7.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,&local_bcc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bc8);
  if (!bVar1) {
    testing::Message::Message(&local_bd8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_bc8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_74.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x179,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_74.message_,&local_bd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_74.message_);
    testing::Message::~Message(&local_bd8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bc8);
  local_bf4 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_bf0,"subtype->is_reference","0",
             (int *)((long)gtest_ar_7.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl + 0x18),&local_bf4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bf0);
  if (!bVar1) {
    testing::Message::Message(&local_c00);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_bf0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_75.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x17a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_75.message_,&local_c00);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_75.message_);
    testing::Message::~Message(&local_c00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bf0);
  local_c1c = adiak_num_subvals((adiak_datatype_t *)
                                gtest_ar_7.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl);
  local_c20 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_c18,"adiak_num_subvals(subtype)","2",&local_c1c,&local_c20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c18);
  if (!bVar1) {
    testing::Message::Message(&local_c28);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c18);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_76.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x17b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_76.message_,&local_c28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_76.message_);
    testing::Message::~Message(&local_c28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c18);
  local_c44 = adiak_get_subval((adiak_datatype_t *)
                               gtest_ar_7.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl,(adiak_value_t *)&subtype,1,
                               (adiak_datatype_t **)&inner_subval.v_ptr,
                               (adiak_value_t *)&gtest_ar_31.message_);
  local_c48 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_c40,
             "adiak_get_subval(subtype, &subval, 1, &inner_subtype, &inner_subval)","0",&local_c44,
             &local_c48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c40);
  if (!bVar1) {
    testing::Message::Message(&local_c50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_77.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x17c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_77.message_,&local_c50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_77.message_);
    testing::Message::~Message(&local_c50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c40);
  local_c6c = adiak_string;
  testing::internal::EqHelper::Compare<adiak_type_t,_adiak_type_t,_nullptr>
            ((EqHelper *)local_c68,"inner_subtype->dtype","adiak_type_t::adiak_string",
             (adiak_type_t *)inner_subval.v_ptr,&local_c6c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c68);
  if (!bVar1) {
    testing::Message::Message(&local_c78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_78.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x17d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_78.message_,&local_c78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_78.message_);
    testing::Message::~Message(&local_c78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c68);
  local_c94 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_c90,"inner_subtype->is_reference","1",
             (int *)(inner_subval.v_long + 0x18),&local_c94);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c90);
  if (!bVar1) {
    testing::Message::Message(&local_ca0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_79.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x17e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_79.message_,&local_ca0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_79.message_);
    testing::Message::~Message(&local_ca0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c90);
  testing::internal::EqHelper::Compare<void_*,_const_char_*,_nullptr>
            ((EqHelper *)local_cb8,"inner_subval.v_ptr","s_hello_data[1].str",
             (void **)&gtest_ar_31.message_,&s_hello_data[1].str);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cb8);
  if (!bVar1) {
    testing::Message::Message(&local_cc0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_cb8);
    testing::internal::AssertHelper::AssertHelper
              (&local_cc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/tests/test_application-api.cpp"
               ,0x17f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_cc8,&local_cc0);
    testing::internal::AssertHelper::~AssertHelper(&local_cc8);
    testing::Message::~Message(&local_cc0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cb8);
  return;
}

Assistant:

TEST(AdiakApplicationAPI, C_ZeroCopyTypes)
{
    /* zero-copy list of ints */
    EXPECT_EQ(adiak_namevalue("cz:ref:vec:int", adiak_general, NULL, "&{%d}", s_array, 9), 0);
    /* a single zero-copy string */
    EXPECT_EQ(adiak_namevalue("cz:ref:string", adiak_general, NULL, "&%s", s_string_a), 0);
    /* set of zero-copy strings (shallow-copies the list but not the strings)*/
    const char* strings[2] = { s_string_a, s_string_b };
    EXPECT_EQ(adiak_namevalue("cz:vec:ref:string", adiak_general, NULL, "[&%s]", strings, 2), 0);
    /* full deep copy list of tuples */
    EXPECT_EQ(adiak_namevalue("cz:vec:tpl", adiak_general, NULL, "{(%lld,%s)}", s_hello_data, 3, 2), 0);
    /* zero-copy list of tuples */
    EXPECT_EQ(adiak_namevalue("cz:ref:vec:tpl", adiak_general, NULL, "&{(%lld,%s)}", s_hello_data, 3, 2), 0);
    /* shallow-copy list of zero-copy tuples
     * Note this still implies a list of structs, *not* a list of pointers to structs
     */
    EXPECT_EQ(adiak_namevalue("cz:vec:ref:tpl", adiak_general, NULL, "{&(%lld,%s)}", s_hello_data, 3, 2), 0);
    /* shallow-copy list of tuples with zero-copy strings */
    EXPECT_EQ(adiak_namevalue("cz:vec:tpl:ref", adiak_general, NULL, "{(%lld,&%s)}", s_hello_data, 3, 2), 0);

    adiak_datatype_t* dtype = nullptr;
    adiak_value_t* val = nullptr;
    int cat = 0;
    const char* subcat = nullptr;
    adiak_value_t subval;
    adiak_datatype_t* subtype = nullptr;

    EXPECT_EQ(adiak_get_nameval("cz:ref:vec:int", &dtype, &val, &cat, &subcat), 0);
    EXPECT_EQ(dtype->dtype, adiak_type_t::adiak_list);
    EXPECT_EQ(dtype->is_reference, 1);
    EXPECT_EQ(cat, adiak_general);
    EXPECT_EQ(adiak_num_subvals(dtype), 9);
    EXPECT_EQ(adiak_get_subval(dtype, val, 0, &subtype, &subval), 0);
    EXPECT_EQ(subtype->dtype, adiak_type_t::adiak_int);
    EXPECT_EQ(subval.v_int, -1);
    EXPECT_EQ(adiak_get_subval(dtype, val, 2, &subtype, &subval), 0);
    EXPECT_EQ(subtype->dtype, adiak_type_t::adiak_int);
    EXPECT_EQ(subval.v_int, -3);

    EXPECT_EQ(adiak_get_nameval("cz:ref:string", &dtype, &val, nullptr, nullptr), 0);
    EXPECT_EQ(dtype->dtype, adiak_type_t::adiak_string);
    EXPECT_EQ(dtype->is_reference, 1);
    EXPECT_STREQ(static_cast<char*>(val->v_ptr), "Static string A");
    EXPECT_EQ(static_cast<const char*>(val->v_ptr), s_string_a);

    EXPECT_EQ(adiak_get_nameval("cz:vec:ref:string", &dtype, &val, &cat, &subcat), 0);
    EXPECT_EQ(dtype->dtype, adiak_type_t::adiak_set);
    EXPECT_EQ(dtype->is_reference, 0);
    EXPECT_EQ(adiak_num_subvals(dtype), 2);
    EXPECT_EQ(adiak_get_subval(dtype, val, 1, &subtype, &subval), 0);
    EXPECT_EQ(subtype->dtype, adiak_type_t::adiak_string);
    EXPECT_EQ(subtype->is_reference, 1);
    EXPECT_EQ(static_cast<const char*>(subval.v_ptr), s_string_b);

    adiak_datatype_t *inner_subtype;
    adiak_value_t inner_subval;

    EXPECT_EQ(adiak_get_nameval("cz:vec:tpl", &dtype, &val, &cat, &subcat), 0);
    EXPECT_EQ(dtype->dtype, adiak_type_t::adiak_list);
    EXPECT_EQ(dtype->is_reference, 0);
    EXPECT_EQ(adiak_num_subvals(dtype), 3);
    EXPECT_EQ(adiak_get_subval(dtype, val, 1, &subtype, &subval), 0);
    EXPECT_EQ(subtype->dtype, adiak_type_t::adiak_tuple);
    EXPECT_EQ(subtype->is_reference, 0);
    EXPECT_EQ(adiak_num_subvals(subtype), 2);
    EXPECT_EQ(adiak_get_subval(subtype, &subval, 1, &inner_subtype, &inner_subval), 0);
    EXPECT_EQ(inner_subtype->dtype, adiak_type_t::adiak_string);
    EXPECT_EQ(inner_subtype->is_reference, 0);
    EXPECT_STREQ(static_cast<const char*>(inner_subval.v_ptr), "Adiak");

    EXPECT_EQ(adiak_get_nameval("cz:ref:vec:tpl", &dtype, &val, &cat, &subcat), 0);
    EXPECT_EQ(dtype->dtype, adiak_type_t::adiak_list);
    EXPECT_EQ(dtype->is_reference, 1);
    EXPECT_EQ(val->v_ptr, s_hello_data);
    EXPECT_EQ(adiak_num_subvals(dtype), 3);
    EXPECT_EQ(adiak_get_subval(dtype, val, 1, &subtype, &subval), 0);
    EXPECT_EQ(subtype->dtype, adiak_type_t::adiak_tuple);
    EXPECT_EQ(subtype->is_reference, 1);
    EXPECT_EQ(adiak_num_subvals(subtype), 2);
    EXPECT_EQ(adiak_get_subval(subtype, &subval, 1, &inner_subtype, &inner_subval), 0);
    EXPECT_EQ(inner_subtype->dtype, adiak_type_t::adiak_string);
    EXPECT_EQ(inner_subtype->is_reference, 1);
    EXPECT_STREQ(static_cast<const char*>(inner_subval.v_ptr), "Adiak");

    EXPECT_EQ(adiak_get_nameval("cz:vec:ref:tpl", &dtype, &val, &cat, &subcat), 0);
    EXPECT_EQ(dtype->dtype, adiak_type_t::adiak_list);
    EXPECT_EQ(dtype->is_reference, 0);
    EXPECT_EQ(adiak_num_subvals(dtype), 3);
    EXPECT_EQ(adiak_get_subval(dtype, val, 1, &subtype, &subval), 0);
    EXPECT_EQ(subtype->dtype, adiak_type_t::adiak_tuple);
    EXPECT_EQ(subtype->is_reference, 1);
    EXPECT_EQ(adiak_num_subvals(subtype), 2);
    EXPECT_EQ(adiak_get_subval(subtype, &subval, 0, &inner_subtype, &inner_subval), 0);
    EXPECT_EQ(inner_subtype->dtype, adiak_type_t::adiak_longlong);
    EXPECT_EQ(inner_subtype->is_reference, 0);
    EXPECT_EQ(inner_subval.v_longlong, 2ll);

    EXPECT_EQ(adiak_get_nameval("cz:vec:tpl:ref", &dtype, &val, &cat, &subcat), 0);
    EXPECT_EQ(dtype->dtype, adiak_type_t::adiak_list);
    EXPECT_EQ(dtype->is_reference, 0);
    EXPECT_EQ(adiak_num_subvals(dtype), 3);
    EXPECT_EQ(adiak_get_subval(dtype, val, 1, &subtype, &subval), 0);
    EXPECT_EQ(subtype->dtype, adiak_type_t::adiak_tuple);
    EXPECT_EQ(subtype->is_reference, 0);
    EXPECT_EQ(adiak_num_subvals(subtype), 2);
    EXPECT_EQ(adiak_get_subval(subtype, &subval, 1, &inner_subtype, &inner_subval), 0);
    EXPECT_EQ(inner_subtype->dtype, adiak_type_t::adiak_string);
    EXPECT_EQ(inner_subtype->is_reference, 1);
    EXPECT_EQ(inner_subval.v_ptr, s_hello_data[1].str);
}